

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

SingleOperationStatistics * __thiscall
deqp::gles3::Performance::(anonymous_namespace)::
calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>>
          (SingleOperationStatistics *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
          *samples,offset_in_SampleType_to_deUint64 target)

{
  value_type vVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  iterator __first;
  iterator __last;
  float fVar5;
  float local_a4;
  float local_94;
  int local_48;
  int ndx;
  allocator<unsigned_long> local_31;
  undefined1 local_30 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  offset_in_SampleType_to_deUint64 target_local;
  vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
  *samples_local;
  
  values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)samples;
  sVar2 = std::
          vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
          ::size((vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                  *)this);
  std::allocator<unsigned_long>::allocator(&local_31);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30,sVar2,&local_31);
  std::allocator<unsigned_long>::~allocator(&local_31);
  for (local_48 = 0;
      sVar2 = std::
              vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
              ::size((vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                      *)this), local_48 < (int)sVar2; local_48 = local_48 + 1) {
    pvVar3 = std::
             vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
             ::operator[]((vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>_>_>
                           *)this,(long)local_48);
    vVar1 = *(value_type *)
             ((long)&(pvVar3->duration).firstRenderDuration +
             (long)values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30,
                        (long)local_48);
    *pvVar4 = vVar1;
  }
  __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30);
  __last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30);
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )__first._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )__last._M_current);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::front
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30);
  local_94 = (float)*pvVar4;
  __return_storage_ptr__->minTime = local_94;
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30);
  local_a4 = (float)*pvVar4;
  __return_storage_ptr__->maxTime = local_a4;
  fVar5 = anon_unknown_1::linearSample<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30,0.5);
  __return_storage_ptr__->medianTime = fVar5;
  fVar5 = anon_unknown_1::linearSample<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30,0.1);
  __return_storage_ptr__->min2DecileTime = fVar5;
  fVar5 = anon_unknown_1::linearSample<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30,0.9);
  __return_storage_ptr__->max9DecileTime = fVar5;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

SingleOperationStatistics calculateSingleOperationStatistics (const std::vector<T>& samples, deUint64 T::SampleType::*target)
{
	SingleOperationStatistics	stats;
	std::vector<deUint64>		values(samples.size());

	for (int ndx = 0; ndx < (int)samples.size(); ++ndx)
		values[ndx] = samples[ndx].duration.*target;

	std::sort(values.begin(), values.end());

	stats.minTime			= (float)values.front();
	stats.maxTime			= (float)values.back();
	stats.medianTime		= linearSample(values, 0.5f);
	stats.min2DecileTime	= linearSample(values, 0.1f);
	stats.max9DecileTime	= linearSample(values, 0.9f);

	return stats;
}